

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

int64_t Assimp::FBX::ParseTokenAsInt64(Token *t,char **err_out)

{
  int64_t iVar1;
  bool bVar2;
  TokenType TVar3;
  char *pcVar4;
  char *pcVar5;
  Token *pTVar6;
  int64_t id;
  char *out;
  uint length;
  int64_t id_1;
  char *data;
  char **err_out_local;
  Token *t_local;
  
  *err_out = (char *)0x0;
  data = (char *)err_out;
  err_out_local = &t->sbegin;
  TVar3 = Token::Type(t);
  if (TVar3 == TokenType_DATA) {
    bVar2 = Token::IsBinary((Token *)err_out_local);
    if (bVar2) {
      id_1 = (int64_t)Token::begin((Token *)err_out_local);
      if (*(char *)id_1 == 'L') {
        pcVar4 = (char *)(id_1 + 1);
        pcVar5 = Token::end((Token *)err_out_local);
        t_local = (Token *)anon_unknown.dwarf_cdd617::SafeParse<long>(pcVar4,pcVar5);
      }
      else {
        *(char **)data = "failed to parse Int64, unexpected data type";
        t_local = (Token *)0x0;
      }
    }
    else {
      pcVar4 = Token::end((Token *)err_out_local);
      pcVar5 = Token::begin((Token *)err_out_local);
      out._4_4_ = (int)pcVar4 - (int)pcVar5;
      id = 0;
      pcVar4 = Token::begin((Token *)err_out_local);
      pTVar6 = (Token *)strtol10_64(pcVar4,(char **)&id,(uint *)((long)&out + 4));
      iVar1 = id;
      pcVar4 = Token::end((Token *)err_out_local);
      t_local = pTVar6;
      if (pcVar4 < (ulong)iVar1) {
        *(char **)data = "failed to parse Int64 (text)";
        t_local = (Token *)0x0;
      }
    }
  }
  else {
    *(char **)data = "expected TOK_DATA token";
    t_local = (Token *)0x0;
  }
  return (int64_t)t_local;
}

Assistant:

int64_t ParseTokenAsInt64(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return 0L;
    }

    if (t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'L') {
            err_out = "failed to parse Int64, unexpected data type";
            return 0L;
        }

        BE_NCONST int64_t id = SafeParse<int64_t>(data + 1, t.end());
        AI_SWAP8(id);
        return id;
    }

    // XXX: should use size_t here
    unsigned int length = static_cast<unsigned int>(t.end() - t.begin());
    ai_assert(length > 0);

    const char* out = nullptr;
    const int64_t id = strtol10_64(t.begin(), &out, &length);
    if (out > t.end()) {
        err_out = "failed to parse Int64 (text)";
        return 0L;
    }

    return id;
}